

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O3

void parse_partname(string *part_name)

{
  long lVar1;
  string frame;
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  lVar1 = std::__cxx11::string::rfind((char *)part_name,0x10c055,0xffffffffffffffff);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)part_name);
    std::__cxx11::string::operator=((string *)part_name,(string *)&local_68);
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
  }
  lVar1 = std::__cxx11::string::rfind((char *)part_name,0x10c057,0xffffffffffffffff);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)part_name);
    std::__cxx11::string::operator=((string *)part_name,(string *)&local_68);
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    lVar1 = std::__cxx11::string::rfind((char *)part_name,0x10c05c,0xffffffffffffffff);
    if (lVar1 != -1) {
      std::__cxx11::string::substr((ulong)&local_68,(ulong)part_name);
      if (local_60 != 0) {
        lVar1 = 0;
        do {
          if (9 < (int)*(char *)((long)local_68 + lVar1) - 0x30U) {
            if (local_60 != lVar1) goto LAB_00104cae;
            break;
          }
          lVar1 = lVar1 + 1;
        } while (local_60 != lVar1);
        std::__cxx11::string::substr((ulong)local_48,(ulong)part_name);
        std::__cxx11::string::operator=((string *)part_name,(string *)local_48);
        if (local_48[0] != local_38) {
          operator_delete(local_48[0],local_38[0] + 1);
        }
      }
LAB_00104cae:
      if (local_68 != local_58) {
        operator_delete(local_68,local_58[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void
parse_partname (string& part_name)
{
    // strip off a path delimitation
    size_t posSlash = part_name.rfind (IMF_PATH_SEPARATOR);
    if (posSlash != string::npos) part_name = part_name.substr (posSlash + 1);

    // strip the exr ext
    size_t pos = part_name.rfind (".exr");
    if (pos != string::npos)
    {
        part_name = part_name.substr (0, pos);

        // strip off the frame number
        size_t pos2 = part_name.rfind (".");
        if (pos2 != string::npos)
        {
            string frame = part_name.substr (pos2 + 1, pos);
            if (is_number (frame)) part_name = part_name.substr (0, pos2);
        }
    }
}